

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_striped_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_trace_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort uVar1;
  ulong uVar3;
  undefined8 *puVar4;
  ushort *puVar5;
  short *psVar6;
  ushort *puVar7;
  void *pvVar8;
  parasail_matrix_t *ppVar9;
  int *piVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar19;
  __m128i *b_00;
  __m128i *palVar20;
  __m128i *ptr;
  __m128i *ptr_00;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  undefined8 uVar25;
  long lVar26;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *palVar27;
  __m128i *ptr_01;
  uint uVar28;
  long lVar29;
  int a;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong size;
  __m128i *ptr_02;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ushort uVar37;
  undefined4 uVar38;
  ushort uVar47;
  ushort uVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ushort uVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar53;
  short sVar54;
  undefined1 auVar52 [16];
  short sVar55;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  ushort uVar61;
  short sVar62;
  ushort uVar63;
  short sVar64;
  short sVar66;
  uint uVar65;
  undefined1 auVar56 [16];
  undefined1 auVar67 [16];
  ushort uVar68;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  undefined1 auVar69 [16];
  ushort uVar77;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  undefined1 auVar78 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  short sVar92;
  short sVar93;
  short sVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  uint local_10c;
  int local_104;
  __m128i *local_f8;
  long local_d8;
  ulong local_c8;
  ushort uVar2;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_trace_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar8 = (profile->profile16).score;
    if (pvVar8 == (void *)0x0) {
      parasail_sw_trace_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar9 = profile->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        parasail_sw_trace_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar28 = profile->s1Len;
        if ((int)uVar28 < 1) {
          parasail_sw_trace_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_trace_striped_profile_sse2_128_16_cold_4();
        }
        else {
          local_c8 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_trace_striped_profile_sse2_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_sw_trace_striped_profile_sse2_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_trace_striped_profile_sse2_128_16_cold_1();
          }
          else {
            uVar22 = (ulong)uVar28 + 7;
            size = uVar22 >> 3;
            iVar18 = ppVar9->max;
            uVar25 = 0x10;
            a = (int)size;
            result = parasail_result_new_trace(a,s2Len,0x10,0x10);
            if (result != (parasail_result_t *)0x0) {
              result->flag = result->flag | 0x8280804;
              b = parasail_memalign___m128i(0x10,size);
              palVar19 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              palVar20 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              local_f8 = parasail_memalign___m128i(0x10,size);
              auVar35._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
              auVar35._4_4_ = -(uint)((int)palVar19 == 0 && (int)((ulong)palVar19 >> 0x20) == 0);
              auVar35._8_4_ = -(uint)((int)b_00 == 0 && (int)((ulong)b_00 >> 0x20) == 0);
              auVar35._12_4_ = -(uint)((int)palVar20 == 0 && (int)((ulong)palVar20 >> 0x20) == 0);
              iVar23 = movmskps((int)uVar25,auVar35);
              len = CONCAT44((int)((ulong)uVar25 >> 0x20),iVar23);
              if (iVar23 != 0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr_00 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_f8 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              auVar35 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar33 = auVar35._0_4_;
              auVar35 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar34 = auVar35._0_4_;
              c[1] = (longlong)local_f8;
              c[0] = size;
              parasail_memset___m128i(b,c,len);
              uVar17 = -open;
              pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),0);
              c_00[1] = extraout_RDX;
              c_00[0] = size;
              parasail_memset___m128i(b_00,c_00,len);
              c_01[1] = extraout_RDX_00;
              c_01[0] = size;
              parasail_memset___m128i(palVar20,c_01,len);
              lVar26 = 0;
              do {
                puVar4 = (undefined8 *)((long)((result->field_4).rowcols)->score_row + lVar26);
                *puVar4 = 0x8000800080008;
                puVar4[1] = 0x8000800080008;
                lVar26 = lVar26 + 0x10;
              } while (size << 4 != lVar26);
              auVar90._4_4_ = uVar33;
              auVar90._0_4_ = uVar33;
              auVar90._8_4_ = uVar33;
              auVar90._12_4_ = uVar33;
              auVar35 = psubsw((undefined1  [16])0x0,auVar90);
              sVar16 = 0x7ffe - (short)iVar18;
              lVar26 = size * 0x10;
              local_10c = (uint)CONCAT62((uint6)(ushort)(sVar16 >> 0xf),0x8000);
              lVar30 = 0;
              local_104 = 0;
              uVar68 = 0;
              uVar70 = 0;
              uVar71 = 0;
              uVar72 = 0;
              uVar73 = 0;
              uVar74 = 0;
              uVar75 = 0;
              uVar76 = 0;
              auVar51 = (undefined1  [16])0x0;
              auVar41._4_4_ = uVar34;
              auVar41._0_4_ = uVar34;
              auVar41._8_4_ = uVar34;
              auVar41._12_4_ = uVar34;
              uVar32 = 0;
              local_d8 = lVar26;
              do {
                ptr_01 = b;
                ptr_02 = ptr;
                ptr = palVar20;
                lVar29 = size * (long)ppVar9->mapper[(byte)s2[uVar32]];
                b = palVar19;
                if (local_104 == (int)uVar32 + -2) {
                  b = local_f8;
                  local_f8 = palVar19;
                }
                uVar3 = ptr_01[a - 1U][0];
                auVar39._0_8_ = uVar3 << 0x10;
                auVar39._8_8_ = ptr_01[a - 1U][1] << 0x10 | uVar3 >> 0x30;
                uVar3 = uVar32 + 1;
                uVar21 = 1;
                lVar31 = 0;
                auVar86 = auVar35;
                do {
                  auVar90 = *(undefined1 (*) [16])((long)*b_00 + lVar31);
                  auVar39 = paddsw(auVar39,*(undefined1 (*) [16])
                                            ((long)pvVar8 + lVar31 + lVar29 * 0x10));
                  uVar46 = (ushort)(-1 < auVar39._0_2_) * auVar39._0_2_;
                  uVar37 = (ushort)(-1 < auVar39._2_2_) * auVar39._2_2_;
                  uVar1 = (ushort)(-1 < auVar39._4_2_) * auVar39._4_2_;
                  uVar2 = (ushort)(-1 < auVar39._6_2_) * auVar39._6_2_;
                  uVar63 = (ushort)(-1 < auVar39._8_2_) * auVar39._8_2_;
                  uVar61 = (ushort)(-1 < auVar39._10_2_) * auVar39._10_2_;
                  uVar48 = (ushort)(-1 < auVar39._12_2_) * auVar39._12_2_;
                  uVar47 = (ushort)(-1 < auVar39._14_2_) * auVar39._14_2_;
                  sVar53 = auVar90._0_2_;
                  uVar77 = (ushort)((short)uVar46 < sVar53) * sVar53 |
                           ((short)uVar46 >= sVar53) * uVar46;
                  sVar53 = auVar90._2_2_;
                  uVar79 = (ushort)((short)uVar37 < sVar53) * sVar53 |
                           ((short)uVar37 >= sVar53) * uVar37;
                  sVar53 = auVar90._4_2_;
                  uVar80 = (ushort)((short)uVar1 < sVar53) * sVar53 |
                           ((short)uVar1 >= sVar53) * uVar1;
                  sVar53 = auVar90._6_2_;
                  uVar81 = (ushort)((short)uVar2 < sVar53) * sVar53 |
                           ((short)uVar2 >= sVar53) * uVar2;
                  sVar53 = auVar90._8_2_;
                  uVar82 = (ushort)((short)uVar63 < sVar53) * sVar53 |
                           ((short)uVar63 >= sVar53) * uVar63;
                  sVar53 = auVar90._10_2_;
                  uVar83 = (ushort)((short)uVar61 < sVar53) * sVar53 |
                           ((short)uVar61 >= sVar53) * uVar61;
                  sVar53 = auVar90._12_2_;
                  uVar84 = (ushort)((short)uVar48 < sVar53) * sVar53 |
                           ((short)uVar48 >= sVar53) * uVar48;
                  sVar53 = auVar90._14_2_;
                  uVar85 = (ushort)((short)uVar47 < sVar53) * sVar53 |
                           ((short)uVar47 >= sVar53) * uVar47;
                  sVar53 = auVar86._0_2_;
                  auVar88._0_2_ =
                       (ushort)((short)uVar77 < sVar53) * sVar53 |
                       ((short)uVar77 >= sVar53) * uVar77;
                  sVar54 = auVar86._2_2_;
                  auVar88._2_2_ =
                       (ushort)((short)uVar79 < sVar54) * sVar54 |
                       ((short)uVar79 >= sVar54) * uVar79;
                  sVar11 = auVar86._4_2_;
                  auVar88._4_2_ =
                       (ushort)((short)uVar80 < sVar11) * sVar11 |
                       ((short)uVar80 >= sVar11) * uVar80;
                  sVar92 = auVar86._6_2_;
                  auVar88._6_2_ =
                       (ushort)((short)uVar81 < sVar92) * sVar92 |
                       ((short)uVar81 >= sVar92) * uVar81;
                  sVar12 = auVar86._8_2_;
                  auVar88._8_2_ =
                       (ushort)((short)uVar82 < sVar12) * sVar12 |
                       ((short)uVar82 >= sVar12) * uVar82;
                  sVar93 = auVar86._10_2_;
                  auVar88._10_2_ =
                       (ushort)((short)uVar83 < sVar93) * sVar93 |
                       ((short)uVar83 >= sVar93) * uVar83;
                  sVar13 = auVar86._12_2_;
                  auVar88._12_2_ =
                       (ushort)((short)uVar84 < sVar13) * sVar13 |
                       ((short)uVar84 >= sVar13) * uVar84;
                  sVar94 = auVar86._14_2_;
                  auVar88._14_2_ =
                       (ushort)((short)uVar85 < sVar94) * sVar94 |
                       ((short)uVar85 >= sVar94) * uVar85;
                  *(undefined1 (*) [16])((long)*b + lVar31) = auVar88;
                  uVar77 = ~-(ushort)(uVar46 == auVar88._0_2_) & 2 - (sVar53 < (short)uVar77) |
                           -(ushort)(0 < (short)auVar88._0_2_ && uVar46 == auVar88._0_2_) & 4;
                  uVar79 = ~-(ushort)(uVar37 == auVar88._2_2_) & 2 - (sVar54 < (short)uVar79) |
                           -(ushort)(0 < (short)auVar88._2_2_ && uVar37 == auVar88._2_2_) & 4;
                  uVar80 = ~-(ushort)(uVar1 == auVar88._4_2_) & 2 - (sVar11 < (short)uVar80) |
                           -(ushort)(0 < (short)auVar88._4_2_ && uVar1 == auVar88._4_2_) & 4;
                  uVar81 = ~-(ushort)(uVar2 == auVar88._6_2_) & 2 - (sVar92 < (short)uVar81) |
                           -(ushort)(0 < (short)auVar88._6_2_ && uVar2 == auVar88._6_2_) & 4;
                  uVar82 = ~-(ushort)(uVar63 == auVar88._8_2_) & 2 - (sVar12 < (short)uVar82) |
                           -(ushort)(0 < (short)auVar88._8_2_ && uVar63 == auVar88._8_2_) & 4;
                  uVar83 = ~-(ushort)(uVar61 == auVar88._10_2_) & 2 - (sVar93 < (short)uVar83) |
                           -(ushort)(0 < (short)auVar88._10_2_ && uVar61 == auVar88._10_2_) & 4;
                  uVar84 = ~-(ushort)(uVar48 == auVar88._12_2_) & 2 - (sVar13 < (short)uVar84) |
                           -(ushort)(0 < (short)auVar88._12_2_ && uVar48 == auVar88._12_2_) & 4;
                  uVar85 = ~-(ushort)(uVar47 == auVar88._14_2_) & 2 - (sVar94 < (short)uVar85) |
                           -(ushort)(0 < (short)auVar88._14_2_ && uVar47 == auVar88._14_2_) & 4;
                  puVar5 = (ushort *)
                           ((long)((result->field_4).rowcols)->score_row + lVar31 + lVar30);
                  uVar37 = *puVar5;
                  uVar46 = puVar5[1];
                  uVar47 = puVar5[2];
                  uVar48 = puVar5[3];
                  uVar61 = puVar5[4];
                  uVar63 = puVar5[5];
                  uVar2 = puVar5[6];
                  uVar1 = puVar5[7];
                  puVar5 = (ushort *)((long)*ptr_00 + lVar31);
                  *puVar5 = uVar77;
                  puVar5[1] = uVar79;
                  puVar5[2] = uVar80;
                  puVar5[3] = uVar81;
                  puVar5[4] = uVar82;
                  puVar5[5] = uVar83;
                  puVar5[6] = uVar84;
                  puVar5[7] = uVar85;
                  puVar5 = (ushort *)
                           ((long)((result->field_4).rowcols)->score_row + lVar31 + lVar30);
                  *puVar5 = uVar37 | uVar77;
                  puVar5[1] = uVar46 | uVar79;
                  puVar5[2] = uVar47 | uVar80;
                  puVar5[3] = uVar48 | uVar81;
                  puVar5[4] = uVar61 | uVar82;
                  puVar5[5] = uVar63 | uVar83;
                  puVar5[6] = uVar2 | uVar84;
                  puVar5[7] = uVar1 | uVar85;
                  auVar14._4_4_ = uVar33;
                  auVar14._0_4_ = uVar33;
                  auVar14._8_4_ = uVar33;
                  auVar14._12_4_ = uVar33;
                  auVar87 = psubsw(auVar88,auVar14);
                  auVar90 = psubsw(auVar90,auVar41);
                  sVar53 = auVar87._0_2_;
                  sVar54 = auVar90._0_2_;
                  sVar11 = auVar87._2_2_;
                  sVar92 = auVar90._2_2_;
                  sVar12 = auVar87._4_2_;
                  sVar93 = auVar90._4_2_;
                  sVar13 = auVar87._6_2_;
                  sVar94 = auVar90._6_2_;
                  sVar55 = auVar87._8_2_;
                  sVar57 = auVar90._8_2_;
                  sVar58 = auVar87._10_2_;
                  sVar59 = auVar90._10_2_;
                  sVar60 = auVar87._12_2_;
                  sVar62 = auVar90._12_2_;
                  sVar66 = auVar90._14_2_;
                  sVar64 = auVar87._14_2_;
                  puVar5 = (ushort *)((long)*b_00 + lVar31);
                  *puVar5 = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54
                  ;
                  puVar5[1] = (ushort)(sVar92 < sVar11) * sVar11 |
                              (ushort)(sVar92 >= sVar11) * sVar92;
                  puVar5[2] = (ushort)(sVar93 < sVar12) * sVar12 |
                              (ushort)(sVar93 >= sVar12) * sVar93;
                  puVar5[3] = (ushort)(sVar94 < sVar13) * sVar13 |
                              (ushort)(sVar94 >= sVar13) * sVar94;
                  puVar5[4] = (ushort)(sVar57 < sVar55) * sVar55 |
                              (ushort)(sVar57 >= sVar55) * sVar57;
                  puVar5[5] = (ushort)(sVar59 < sVar58) * sVar58 |
                              (ushort)(sVar59 >= sVar58) * sVar59;
                  puVar5[6] = (ushort)(sVar62 < sVar60) * sVar60 |
                              (ushort)(sVar62 >= sVar60) * sVar62;
                  puVar5[7] = (ushort)(sVar66 < sVar64) * sVar64 |
                              (ushort)(sVar66 >= sVar64) * sVar66;
                  auVar90 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar31),auVar41);
                  sVar54 = auVar90._0_2_;
                  sVar92 = auVar90._2_2_;
                  sVar93 = auVar90._4_2_;
                  sVar94 = auVar90._6_2_;
                  sVar57 = auVar90._8_2_;
                  sVar59 = auVar90._10_2_;
                  sVar62 = auVar90._12_2_;
                  sVar66 = auVar90._14_2_;
                  puVar5 = (ushort *)((long)*ptr_02 + lVar31);
                  *puVar5 = (ushort)(sVar53 < sVar54) * sVar54 | (ushort)(sVar53 >= sVar54) * sVar53
                  ;
                  puVar5[1] = (ushort)(sVar11 < sVar92) * sVar92 |
                              (ushort)(sVar11 >= sVar92) * sVar11;
                  puVar5[2] = (ushort)(sVar12 < sVar93) * sVar93 |
                              (ushort)(sVar12 >= sVar93) * sVar12;
                  puVar5[3] = (ushort)(sVar13 < sVar94) * sVar94 |
                              (ushort)(sVar13 >= sVar94) * sVar13;
                  puVar5[4] = (ushort)(sVar55 < sVar57) * sVar57 |
                              (ushort)(sVar55 >= sVar57) * sVar55;
                  puVar5[5] = (ushort)(sVar58 < sVar59) * sVar59 |
                              (ushort)(sVar58 >= sVar59) * sVar58;
                  puVar5[6] = (ushort)(sVar60 < sVar62) * sVar62 |
                              (ushort)(sVar60 >= sVar62) * sVar60;
                  puVar5[7] = (ushort)(sVar64 < sVar66) * sVar66 |
                              (ushort)(sVar64 >= sVar66) * sVar64;
                  if (uVar3 < local_c8) {
                    puVar5 = (ushort *)
                             ((long)((result->field_4).rowcols)->score_row + lVar31 + local_d8);
                    *puVar5 = -(ushort)(sVar54 < sVar53) & 0x18 ^ 0x10;
                    puVar5[1] = -(ushort)(sVar92 < sVar11) & 0x18 ^ 0x10;
                    puVar5[2] = -(ushort)(sVar93 < sVar12) & 0x18 ^ 0x10;
                    puVar5[3] = -(ushort)(sVar94 < sVar13) & 0x18 ^ 0x10;
                    puVar5[4] = -(ushort)(sVar57 < sVar55) & 0x18 ^ 0x10;
                    puVar5[5] = -(ushort)(sVar59 < sVar58) & 0x18 ^ 0x10;
                    puVar5[6] = -(ushort)(sVar62 < sVar60) & 0x18 ^ 0x10;
                    puVar5[7] = -(ushort)(sVar66 < sVar64) & 0x18 ^ 0x10;
                  }
                  auVar91 = psubsw(auVar86,auVar41);
                  sVar54 = auVar91._0_2_;
                  sVar92 = auVar91._2_2_;
                  sVar93 = auVar91._4_2_;
                  sVar94 = auVar91._6_2_;
                  sVar57 = auVar91._8_2_;
                  sVar59 = auVar91._10_2_;
                  sVar62 = auVar91._12_2_;
                  sVar66 = auVar91._14_2_;
                  if (uVar21 < size) {
                    piVar10 = ((result->field_4).rowcols)->score_row;
                    puVar5 = (ushort *)((long)piVar10 + lVar31 + 0x10 + lVar30);
                    uVar37 = puVar5[1];
                    uVar46 = puVar5[2];
                    uVar47 = puVar5[3];
                    uVar48 = puVar5[4];
                    uVar61 = puVar5[5];
                    uVar63 = puVar5[6];
                    uVar2 = puVar5[7];
                    puVar7 = (ushort *)((long)piVar10 + lVar31 + 0x10 + lVar30);
                    *puVar7 = -(ushort)(sVar54 < sVar53) & 0x60 ^ 0x40 | *puVar5;
                    puVar7[1] = -(ushort)(sVar92 < sVar11) & 0x60 ^ 0x40 | uVar37;
                    puVar7[2] = -(ushort)(sVar93 < sVar12) & 0x60 ^ 0x40 | uVar46;
                    puVar7[3] = -(ushort)(sVar94 < sVar13) & 0x60 ^ 0x40 | uVar47;
                    puVar7[4] = -(ushort)(sVar57 < sVar55) & 0x60 ^ 0x40 | uVar48;
                    puVar7[5] = -(ushort)(sVar59 < sVar58) & 0x60 ^ 0x40 | uVar61;
                    puVar7[6] = -(ushort)(sVar62 < sVar60) & 0x60 ^ 0x40 | uVar63;
                    puVar7[7] = -(ushort)(sVar66 < sVar64) & 0x60 ^ 0x40 | uVar2;
                  }
                  uVar68 = ((short)uVar68 < (short)auVar88._0_2_) * auVar88._0_2_ |
                           ((short)uVar68 >= (short)auVar88._0_2_) * uVar68;
                  uVar70 = ((short)uVar70 < (short)auVar88._2_2_) * auVar88._2_2_ |
                           ((short)uVar70 >= (short)auVar88._2_2_) * uVar70;
                  uVar71 = ((short)uVar71 < (short)auVar88._4_2_) * auVar88._4_2_ |
                           ((short)uVar71 >= (short)auVar88._4_2_) * uVar71;
                  uVar72 = ((short)uVar72 < (short)auVar88._6_2_) * auVar88._6_2_ |
                           ((short)uVar72 >= (short)auVar88._6_2_) * uVar72;
                  uVar73 = ((short)uVar73 < (short)auVar88._8_2_) * auVar88._8_2_ |
                           ((short)uVar73 >= (short)auVar88._8_2_) * uVar73;
                  uVar74 = ((short)uVar74 < (short)auVar88._10_2_) * auVar88._10_2_ |
                           ((short)uVar74 >= (short)auVar88._10_2_) * uVar74;
                  uVar75 = ((short)uVar75 < (short)auVar88._12_2_) * auVar88._12_2_ |
                           ((short)uVar75 >= (short)auVar88._12_2_) * uVar75;
                  uVar76 = ((short)uVar76 < (short)auVar88._14_2_) * auVar88._14_2_ |
                           ((short)uVar76 >= (short)auVar88._14_2_) * uVar76;
                  auVar86._0_2_ =
                       (ushort)(sVar53 < sVar54) * sVar54 | (ushort)(sVar53 >= sVar54) * sVar53;
                  auVar86._2_2_ =
                       (ushort)(sVar11 < sVar92) * sVar92 | (ushort)(sVar11 >= sVar92) * sVar11;
                  auVar86._4_2_ =
                       (ushort)(sVar12 < sVar93) * sVar93 | (ushort)(sVar12 >= sVar93) * sVar12;
                  auVar86._6_2_ =
                       (ushort)(sVar13 < sVar94) * sVar94 | (ushort)(sVar13 >= sVar94) * sVar13;
                  auVar86._8_2_ =
                       (ushort)(sVar55 < sVar57) * sVar57 | (ushort)(sVar55 >= sVar57) * sVar55;
                  auVar86._10_2_ =
                       (ushort)(sVar58 < sVar59) * sVar59 | (ushort)(sVar58 >= sVar59) * sVar58;
                  auVar86._12_2_ =
                       (ushort)(sVar60 < sVar62) * sVar62 | (ushort)(sVar60 >= sVar62) * sVar60;
                  auVar86._14_2_ =
                       (ushort)(sVar64 < sVar66) * sVar66 | (ushort)(sVar64 >= sVar66) * sVar64;
                  auVar39 = *(undefined1 (*) [16])((long)*ptr_01 + lVar31);
                  lVar31 = lVar31 + 0x10;
                  uVar21 = uVar21 + 1;
                } while (lVar26 != lVar31);
                iVar18 = 0;
                auVar89 = auVar86;
                do {
                  uVar21 = auVar89._0_8_;
                  auVar89._8_8_ = auVar89._8_8_ << 0x10 | uVar21 >> 0x30;
                  uVar37 = (ushort)uVar17;
                  auVar89._0_8_ = uVar21 << 0x10 | (ulong)uVar37;
                  uVar21 = auVar91._0_8_;
                  auVar91._8_8_ = auVar91._8_8_ << 0x10 | uVar21 >> 0x30;
                  auVar91._0_8_ = uVar21 << 0x10 | 0x8000;
                  uVar21 = auVar86._0_8_;
                  auVar86._8_8_ = auVar86._8_8_ << 0x10 | uVar21 >> 0x30;
                  auVar86._0_8_ = uVar21 << 0x10 | (ulong)uVar37;
                  uVar21 = auVar87._0_8_;
                  auVar87._8_8_ = auVar87._8_8_ << 0x10 | uVar21 >> 0x30;
                  auVar87._0_8_ = uVar21 << 0x10 | (ulong)uVar37;
                  uVar21 = ptr_01[a - 1U][0];
                  auVar40._0_8_ = uVar21 << 0x10;
                  auVar40._8_8_ = ptr_01[a - 1U][1] << 0x10 | uVar21 >> 0x30;
                  lVar31 = 0;
                  do {
                    psVar6 = (short *)((long)*b + lVar31);
                    sVar55 = *psVar6;
                    sVar57 = psVar6[1];
                    sVar58 = psVar6[2];
                    sVar59 = psVar6[3];
                    sVar60 = psVar6[4];
                    sVar62 = psVar6[5];
                    sVar64 = psVar6[6];
                    sVar66 = psVar6[7];
                    sVar53 = auVar86._0_2_;
                    auVar78._0_2_ =
                         (ushort)(sVar55 < sVar53) * sVar53 | (ushort)(sVar55 >= sVar53) * sVar55;
                    sVar54 = auVar86._2_2_;
                    auVar78._2_2_ =
                         (ushort)(sVar57 < sVar54) * sVar54 | (ushort)(sVar57 >= sVar54) * sVar57;
                    sVar11 = auVar86._4_2_;
                    auVar78._4_2_ =
                         (ushort)(sVar58 < sVar11) * sVar11 | (ushort)(sVar58 >= sVar11) * sVar58;
                    sVar92 = auVar86._6_2_;
                    auVar78._6_2_ =
                         (ushort)(sVar59 < sVar92) * sVar92 | (ushort)(sVar59 >= sVar92) * sVar59;
                    sVar12 = auVar86._8_2_;
                    auVar78._8_2_ =
                         (ushort)(sVar60 < sVar12) * sVar12 | (ushort)(sVar60 >= sVar12) * sVar60;
                    sVar93 = auVar86._10_2_;
                    auVar78._10_2_ =
                         (ushort)(sVar62 < sVar93) * sVar93 | (ushort)(sVar62 >= sVar93) * sVar62;
                    sVar13 = auVar86._12_2_;
                    auVar78._12_2_ =
                         (ushort)(sVar64 < sVar13) * sVar13 | (ushort)(sVar64 >= sVar13) * sVar64;
                    sVar94 = auVar86._14_2_;
                    auVar78._14_2_ =
                         (ushort)(sVar66 < sVar94) * sVar94 | (ushort)(sVar66 >= sVar94) * sVar66;
                    *(undefined1 (*) [16])((long)*b + lVar31) = auVar78;
                    auVar90 = paddsw(auVar40,*(undefined1 (*) [16])
                                              ((long)pvVar8 + lVar31 + lVar29 * 0x10));
                    uVar77 = -(ushort)(sVar53 < sVar55 ||
                                      (ushort)((ushort)(-1 < auVar90._0_2_) * auVar90._0_2_) ==
                                      auVar78._0_2_);
                    uVar79 = -(ushort)(sVar54 < sVar57 ||
                                      (ushort)((ushort)(-1 < auVar90._2_2_) * auVar90._2_2_) ==
                                      auVar78._2_2_);
                    uVar80 = -(ushort)(sVar11 < sVar58 ||
                                      (ushort)((ushort)(-1 < auVar90._4_2_) * auVar90._4_2_) ==
                                      auVar78._4_2_);
                    uVar81 = -(ushort)(sVar92 < sVar59 ||
                                      (ushort)((ushort)(-1 < auVar90._6_2_) * auVar90._6_2_) ==
                                      auVar78._6_2_);
                    uVar82 = -(ushort)(sVar12 < sVar60 ||
                                      (ushort)((ushort)(-1 < auVar90._8_2_) * auVar90._8_2_) ==
                                      auVar78._8_2_);
                    uVar83 = -(ushort)(sVar93 < sVar62 ||
                                      (ushort)((ushort)(-1 < auVar90._10_2_) * auVar90._10_2_) ==
                                      auVar78._10_2_);
                    uVar84 = -(ushort)(sVar13 < sVar64 ||
                                      (ushort)((ushort)(-1 < auVar90._12_2_) * auVar90._12_2_) ==
                                      auVar78._12_2_);
                    uVar85 = -(ushort)(sVar94 < sVar66 ||
                                      (ushort)((ushort)(-1 < auVar90._14_2_) * auVar90._14_2_) ==
                                      auVar78._14_2_);
                    puVar5 = (ushort *)
                             ((long)((result->field_4).rowcols)->score_row + lVar31 + lVar30);
                    uVar37 = *puVar5;
                    uVar46 = puVar5[1];
                    uVar47 = puVar5[2];
                    uVar48 = puVar5[3];
                    uVar61 = puVar5[4];
                    uVar63 = puVar5[5];
                    uVar2 = puVar5[6];
                    uVar1 = puVar5[7];
                    puVar5 = (ushort *)((long)*ptr_00 + lVar31);
                    uVar77 = ~uVar77 & 2 | *puVar5 & uVar77;
                    uVar79 = ~uVar79 & 2 | puVar5[1] & uVar79;
                    uVar80 = ~uVar80 & 2 | puVar5[2] & uVar80;
                    uVar81 = ~uVar81 & 2 | puVar5[3] & uVar81;
                    uVar82 = ~uVar82 & 2 | puVar5[4] & uVar82;
                    uVar83 = ~uVar83 & 2 | puVar5[5] & uVar83;
                    uVar84 = ~uVar84 & 2 | puVar5[6] & uVar84;
                    uVar85 = ~uVar85 & 2 | puVar5[7] & uVar85;
                    puVar5 = (ushort *)((long)*ptr_00 + lVar31);
                    *puVar5 = uVar77;
                    puVar5[1] = uVar79;
                    puVar5[2] = uVar80;
                    puVar5[3] = uVar81;
                    puVar5[4] = uVar82;
                    puVar5[5] = uVar83;
                    puVar5[6] = uVar84;
                    puVar5[7] = uVar85;
                    puVar5 = (ushort *)
                             ((long)((result->field_4).rowcols)->score_row + lVar31 + lVar30);
                    *puVar5 = uVar77 | uVar37 & 0x78;
                    puVar5[1] = uVar79 | uVar46 & 0x78;
                    puVar5[2] = uVar80 | uVar47 & 0x78;
                    puVar5[3] = uVar81 | uVar48 & 0x78;
                    puVar5[4] = uVar82 | uVar61 & 0x78;
                    puVar5[5] = uVar83 | uVar63 & 0x78;
                    puVar5[6] = uVar84 | uVar2 & 0x78;
                    puVar5[7] = uVar85 | uVar1 & 0x78;
                    piVar10 = ((result->field_4).rowcols)->score_row;
                    puVar5 = (ushort *)((long)piVar10 + lVar31 + lVar30);
                    uVar37 = puVar5[1];
                    uVar46 = puVar5[2];
                    uVar47 = puVar5[3];
                    uVar48 = puVar5[4];
                    uVar61 = puVar5[5];
                    uVar63 = puVar5[6];
                    uVar2 = puVar5[7];
                    puVar7 = (ushort *)((long)piVar10 + lVar31 + lVar30);
                    *puVar7 = (*puVar5 & 0x1f | -(ushort)(auVar91._0_2_ < auVar87._0_2_) & 0x60) ^
                              0x40;
                    puVar7[1] = (uVar37 & 0x1f | -(ushort)(auVar91._2_2_ < auVar87._2_2_) & 0x60) ^
                                0x40;
                    puVar7[2] = (uVar46 & 0x1f | -(ushort)(auVar91._4_2_ < auVar87._4_2_) & 0x60) ^
                                0x40;
                    puVar7[3] = (uVar47 & 0x1f | -(ushort)(auVar91._6_2_ < auVar87._6_2_) & 0x60) ^
                                0x40;
                    puVar7[4] = (uVar48 & 0x1f | -(ushort)(auVar91._8_2_ < auVar87._8_2_) & 0x60) ^
                                0x40;
                    puVar7[5] = (uVar61 & 0x1f | -(ushort)(auVar91._10_2_ < auVar87._10_2_) & 0x60)
                                ^ 0x40;
                    puVar7[6] = (uVar63 & 0x1f | -(ushort)(auVar91._12_2_ < auVar87._12_2_) & 0x60)
                                ^ 0x40;
                    puVar7[7] = (uVar2 & 0x1f | -(ushort)(auVar91._14_2_ < auVar87._14_2_) & 0x60) ^
                                0x40;
                    auVar15._4_4_ = uVar33;
                    auVar15._0_4_ = uVar33;
                    auVar15._8_4_ = uVar33;
                    auVar15._12_4_ = uVar33;
                    auVar87 = psubsw(auVar78,auVar15);
                    auVar41 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar31),auVar41);
                    sVar53 = auVar41._0_2_;
                    sVar55 = auVar87._0_2_;
                    sVar54 = auVar41._2_2_;
                    sVar57 = auVar87._2_2_;
                    sVar11 = auVar41._4_2_;
                    sVar58 = auVar87._4_2_;
                    sVar92 = auVar41._6_2_;
                    sVar59 = auVar87._6_2_;
                    sVar12 = auVar41._8_2_;
                    sVar60 = auVar87._8_2_;
                    sVar93 = auVar41._10_2_;
                    sVar62 = auVar87._10_2_;
                    sVar13 = auVar41._12_2_;
                    sVar64 = auVar87._12_2_;
                    sVar66 = auVar87._14_2_;
                    sVar94 = auVar41._14_2_;
                    puVar5 = (ushort *)((long)*ptr_02 + lVar31);
                    *puVar5 = (ushort)(sVar55 < sVar53) * sVar53 |
                              (ushort)(sVar55 >= sVar53) * sVar55;
                    puVar5[1] = (ushort)(sVar57 < sVar54) * sVar54 |
                                (ushort)(sVar57 >= sVar54) * sVar57;
                    puVar5[2] = (ushort)(sVar58 < sVar11) * sVar11 |
                                (ushort)(sVar58 >= sVar11) * sVar58;
                    puVar5[3] = (ushort)(sVar59 < sVar92) * sVar92 |
                                (ushort)(sVar59 >= sVar92) * sVar59;
                    puVar5[4] = (ushort)(sVar60 < sVar12) * sVar12 |
                                (ushort)(sVar60 >= sVar12) * sVar60;
                    puVar5[5] = (ushort)(sVar62 < sVar93) * sVar93 |
                                (ushort)(sVar62 >= sVar93) * sVar62;
                    puVar5[6] = (ushort)(sVar64 < sVar13) * sVar13 |
                                (ushort)(sVar64 >= sVar13) * sVar64;
                    puVar5[7] = (ushort)(sVar66 < sVar94) * sVar94 |
                                (ushort)(sVar66 >= sVar94) * sVar66;
                    if (uVar3 < local_c8) {
                      puVar5 = (ushort *)
                               ((long)((result->field_4).rowcols)->score_row + lVar31 + local_d8);
                      *puVar5 = -(ushort)(sVar53 < sVar55) & 0x18 ^ 0x10;
                      puVar5[1] = -(ushort)(sVar54 < sVar57) & 0x18 ^ 0x10;
                      puVar5[2] = -(ushort)(sVar11 < sVar58) & 0x18 ^ 0x10;
                      puVar5[3] = -(ushort)(sVar92 < sVar59) & 0x18 ^ 0x10;
                      puVar5[4] = -(ushort)(sVar12 < sVar60) & 0x18 ^ 0x10;
                      puVar5[5] = -(ushort)(sVar93 < sVar62) & 0x18 ^ 0x10;
                      puVar5[6] = -(ushort)(sVar13 < sVar64) & 0x18 ^ 0x10;
                      puVar5[7] = -(ushort)(sVar94 < sVar66) & 0x18 ^ 0x10;
                    }
                    uVar68 = ((short)uVar68 < (short)auVar78._0_2_) * auVar78._0_2_ |
                             ((short)uVar68 >= (short)auVar78._0_2_) * uVar68;
                    uVar70 = ((short)uVar70 < (short)auVar78._2_2_) * auVar78._2_2_ |
                             ((short)uVar70 >= (short)auVar78._2_2_) * uVar70;
                    uVar71 = ((short)uVar71 < (short)auVar78._4_2_) * auVar78._4_2_ |
                             ((short)uVar71 >= (short)auVar78._4_2_) * uVar71;
                    uVar72 = ((short)uVar72 < (short)auVar78._6_2_) * auVar78._6_2_ |
                             ((short)uVar72 >= (short)auVar78._6_2_) * uVar72;
                    uVar73 = ((short)uVar73 < (short)auVar78._8_2_) * auVar78._8_2_ |
                             ((short)uVar73 >= (short)auVar78._8_2_) * uVar73;
                    uVar74 = ((short)uVar74 < (short)auVar78._10_2_) * auVar78._10_2_ |
                             ((short)uVar74 >= (short)auVar78._10_2_) * uVar74;
                    uVar75 = ((short)uVar75 < (short)auVar78._12_2_) * auVar78._12_2_ |
                             ((short)uVar75 >= (short)auVar78._12_2_) * uVar75;
                    uVar76 = ((short)uVar76 < (short)auVar78._14_2_) * auVar78._14_2_ |
                             ((short)uVar76 >= (short)auVar78._14_2_) * uVar76;
                    auVar86 = psubsw(auVar86,auVar41);
                    auVar42._0_2_ = -(ushort)(auVar86._0_2_ < sVar55);
                    auVar42._2_2_ = -(ushort)(auVar86._2_2_ < sVar57);
                    auVar42._4_2_ = -(ushort)(auVar86._4_2_ < sVar58);
                    auVar42._6_2_ = -(ushort)(auVar86._6_2_ < sVar59);
                    auVar42._8_2_ = -(ushort)(auVar86._8_2_ < sVar60);
                    auVar42._10_2_ = -(ushort)(auVar86._10_2_ < sVar62);
                    auVar42._12_2_ = -(ushort)(auVar86._12_2_ < sVar64);
                    auVar42._14_2_ = -(ushort)(auVar86._14_2_ < sVar66);
                    if ((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(auVar42._14_2_ >> 7) & 1) << 0xe |
                                auVar42._14_2_ & 0x8000) == 0xffff) goto LAB_00671dcf;
                    auVar91 = psubsw(auVar89,auVar41);
                    sVar53 = auVar91._0_2_;
                    auVar89._0_2_ =
                         (ushort)(sVar55 < sVar53) * sVar53 | (ushort)(sVar55 >= sVar53) * sVar55;
                    sVar53 = auVar91._2_2_;
                    auVar89._2_2_ =
                         (ushort)(sVar57 < sVar53) * sVar53 | (ushort)(sVar57 >= sVar53) * sVar57;
                    sVar53 = auVar91._4_2_;
                    auVar89._4_2_ =
                         (ushort)(sVar58 < sVar53) * sVar53 | (ushort)(sVar58 >= sVar53) * sVar58;
                    sVar53 = auVar91._6_2_;
                    auVar89._6_2_ =
                         (ushort)(sVar59 < sVar53) * sVar53 | (ushort)(sVar59 >= sVar53) * sVar59;
                    sVar53 = auVar91._8_2_;
                    auVar89._8_2_ =
                         (ushort)(sVar60 < sVar53) * sVar53 | (ushort)(sVar60 >= sVar53) * sVar60;
                    sVar53 = auVar91._10_2_;
                    auVar89._10_2_ =
                         (ushort)(sVar62 < sVar53) * sVar53 | (ushort)(sVar62 >= sVar53) * sVar62;
                    sVar53 = auVar91._12_2_;
                    auVar89._12_2_ =
                         (ushort)(sVar64 < sVar53) * sVar53 | (ushort)(sVar64 >= sVar53) * sVar64;
                    sVar53 = auVar91._14_2_;
                    auVar89._14_2_ =
                         (ushort)(sVar66 < sVar53) * sVar53 | (ushort)(sVar66 >= sVar53) * sVar66;
                    auVar40 = *(undefined1 (*) [16])((long)*ptr_01 + lVar31);
                    lVar31 = lVar31 + 0x10;
                  } while (lVar26 != lVar31);
                  iVar18 = iVar18 + 1;
                } while (iVar18 != 8);
LAB_00671dcf:
                auVar43._0_2_ = -(ushort)(auVar51._0_2_ < (short)uVar68);
                auVar43._2_2_ = -(ushort)(auVar51._2_2_ < (short)uVar70);
                auVar43._4_2_ = -(ushort)(auVar51._4_2_ < (short)uVar71);
                auVar43._6_2_ = -(ushort)(auVar51._6_2_ < (short)uVar72);
                auVar43._8_2_ = -(ushort)(auVar51._8_2_ < (short)uVar73);
                auVar43._10_2_ = -(ushort)(auVar51._10_2_ < (short)uVar74);
                auVar43._12_2_ = -(ushort)(auVar51._12_2_ < (short)uVar75);
                auVar43._14_2_ = -(ushort)(auVar51._14_2_ < (short)uVar76);
                if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar43 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar43 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar43 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar43 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar43 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar43 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43._14_2_ >> 7 & 1) != 0) || (auVar43._14_2_ & 0x8000) != 0) {
                  uVar37 = ((short)uVar73 < (short)uVar68) * uVar68 |
                           ((short)uVar73 >= (short)uVar68) * uVar73;
                  uVar46 = ((short)uVar74 < (short)uVar70) * uVar70 |
                           ((short)uVar74 >= (short)uVar70) * uVar74;
                  uVar47 = ((short)uVar75 < (short)uVar71) * uVar71 |
                           ((short)uVar75 >= (short)uVar71) * uVar75;
                  uVar48 = ((short)uVar76 < (short)uVar72) * uVar72 |
                           ((short)uVar76 >= (short)uVar72) * uVar76;
                  sVar54 = (0 < (short)uVar73) * uVar73;
                  sVar53 = (0 < (short)uVar74) * uVar74;
                  sVar92 = (0 < (short)uVar75) * uVar75;
                  sVar11 = (0 < (short)uVar76) * uVar76;
                  uVar37 = ((short)uVar47 < (short)uVar37) * uVar37 |
                           ((short)uVar47 >= (short)uVar37) * uVar47;
                  uVar46 = ((short)uVar48 < (short)uVar46) * uVar46 |
                           ((short)uVar48 >= (short)uVar46) * uVar48;
                  uVar47 = (sVar54 < (short)uVar47) * uVar47 |
                           (ushort)(sVar54 >= (short)uVar47) * sVar54;
                  uVar48 = (sVar53 < (short)uVar48) * uVar48 |
                           (ushort)(sVar53 >= (short)uVar48) * sVar53;
                  uVar61 = (ushort)(sVar92 < sVar54) * sVar54 | (ushort)(sVar92 >= sVar54) * sVar92;
                  uVar63 = (ushort)(sVar11 < sVar53) * sVar53 | (ushort)(sVar11 >= sVar53) * sVar11;
                  sVar92 = (ushort)(0 < sVar92) * sVar92;
                  sVar11 = (ushort)(0 < sVar11) * sVar11;
                  uVar37 = ((short)uVar46 < (short)uVar37) * uVar37 |
                           ((short)uVar46 >= (short)uVar37) * uVar46;
                  auVar44._0_4_ =
                       CONCAT22(((short)uVar47 < (short)uVar46) * uVar46 |
                                ((short)uVar47 >= (short)uVar46) * uVar47,uVar37);
                  auVar44._4_2_ =
                       ((short)uVar48 < (short)uVar47) * uVar47 |
                       ((short)uVar48 >= (short)uVar47) * uVar48;
                  auVar44._6_2_ =
                       ((short)uVar61 < (short)uVar48) * uVar48 |
                       ((short)uVar61 >= (short)uVar48) * uVar61;
                  auVar44._8_2_ =
                       ((short)uVar63 < (short)uVar61) * uVar61 |
                       ((short)uVar63 >= (short)uVar61) * uVar63;
                  auVar44._10_2_ =
                       (sVar92 < (short)uVar63) * uVar63 |
                       (ushort)(sVar92 >= (short)uVar63) * sVar92;
                  auVar44._12_2_ =
                       (ushort)(sVar11 < sVar92) * sVar92 | (ushort)(sVar11 >= sVar92) * sVar11;
                  auVar44._14_2_ = (ushort)(0 < sVar11) * sVar11;
                  local_10c = auVar44._0_4_;
                  if (sVar16 < (short)uVar37) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    local_c8 = uVar32;
                    break;
                  }
                  auVar41 = pshuflw(auVar44,auVar44,0);
                  uVar38 = auVar41._0_4_;
                  auVar51._4_4_ = uVar38;
                  auVar51._0_4_ = uVar38;
                  auVar51._8_4_ = uVar38;
                  auVar51._12_4_ = uVar38;
                  local_104 = (int)uVar32;
                }
                local_d8 = local_d8 + lVar26;
                lVar30 = lVar30 + lVar26;
                palVar19 = ptr_01;
                palVar20 = ptr_02;
                uVar32 = uVar3;
              } while (uVar3 != local_c8);
              if ((short)local_10c == 0x7fff) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
              }
              iVar18 = parasail_result_is_saturated(result);
              iVar23 = 0;
              palVar19 = b;
              if (iVar18 == 0) {
                palVar27 = ptr_01;
                palVar20 = local_f8;
                if (local_104 == (int)local_c8 + -2) {
                  palVar27 = local_f8;
                  palVar20 = ptr_01;
                }
                if (local_104 == (int)local_c8 + -1) {
                  palVar19 = local_f8;
                  palVar20 = b;
                  palVar27 = ptr_01;
                }
                ptr_01 = palVar27;
                local_f8 = palVar20;
                uVar28 = uVar28 - 1;
                if ((uVar22 & 0x7ffffff8) != 0) {
                  uVar17 = (uint)uVar22 & 0x7ffffff8;
                  if ((uVar22 & 0x7ffffff8) == 0) {
                    uVar22 = 0;
                    do {
                      uVar24 = (uint)(uVar22 >> 3) & 0x1fffffff;
                      if ((int)uVar28 <= (int)uVar24) {
                        uVar24 = uVar28;
                      }
                      if (*(short *)((long)*local_f8 + uVar22 * 2) == (short)local_10c) {
                        uVar28 = uVar24;
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar17 != (uint)uVar22);
                  }
                  else {
                    auVar36._4_4_ = uVar28;
                    auVar36._0_4_ = uVar28;
                    auVar36._8_4_ = uVar28;
                    auVar36._12_4_ = uVar28;
                    auVar35 = pshuflw(ZEXT416(local_10c),ZEXT416(local_10c),0);
                    uVar22 = 0;
                    auVar50 = _DAT_00904a60;
                    do {
                      uVar25 = *(undefined8 *)((long)*local_f8 + uVar22 * 2);
                      auVar52._0_2_ = -(ushort)((short)uVar25 == auVar35._0_2_);
                      sVar16 = -(ushort)((short)((ulong)uVar25 >> 0x10) == auVar35._2_2_);
                      sVar53 = -(ushort)((short)((ulong)uVar25 >> 0x20) == auVar35._4_2_);
                      sVar54 = -(ushort)((short)((ulong)uVar25 >> 0x30) == auVar35._6_2_);
                      auVar52._8_8_ =
                           (undefined8)
                           (CONCAT64(CONCAT42(CONCAT22(sVar54,sVar54),sVar53),
                                     CONCAT22(sVar53,sVar54)) >> 0x10);
                      auVar52._6_2_ = sVar16;
                      auVar52._4_2_ = sVar16;
                      auVar52._2_2_ = auVar52._0_2_;
                      uVar28 = auVar50._4_4_;
                      uVar24 = auVar50._8_4_;
                      uVar65 = auVar50._12_4_;
                      auVar41 = auVar50 & _DAT_00904b30;
                      iVar18 = auVar41._4_4_;
                      auVar69._4_4_ = iVar18;
                      auVar69._0_4_ = iVar18;
                      auVar69._8_4_ = auVar41._12_4_;
                      auVar69._12_4_ = auVar41._12_4_;
                      auVar67._0_4_ = auVar41._0_4_ * a + (auVar50._0_4_ >> 3);
                      auVar67._4_4_ = iVar18 * a + (uVar28 >> 3);
                      auVar67._8_4_ = (int)((auVar41._8_8_ & 0xffffffff) * size) + (uVar24 >> 3);
                      auVar67._12_4_ = (int)((auVar69._8_8_ & 0xffffffff) * size) + (uVar65 >> 3);
                      auVar56._0_4_ = -(uint)(auVar67._0_4_ < auVar36._0_4_);
                      auVar56._4_4_ = -(uint)(auVar67._4_4_ < auVar36._4_4_);
                      auVar56._8_4_ = -(uint)(auVar67._8_4_ < auVar36._8_4_);
                      auVar56._12_4_ = -(uint)(auVar67._12_4_ < auVar36._12_4_);
                      auVar36 = ~auVar52 & auVar36 |
                                (~auVar56 & auVar36 | auVar67 & auVar56) & auVar52;
                      uVar22 = uVar22 + 4;
                      auVar50._0_4_ = auVar50._0_4_ + 4;
                      auVar50._4_4_ = uVar28 + 4;
                      auVar50._8_4_ = uVar24 + 4;
                      auVar50._12_4_ = uVar65 + 4;
                    } while (uVar17 != uVar22);
                    auVar45._0_8_ = auVar36._8_8_;
                    auVar45._8_4_ = auVar36._8_4_;
                    auVar45._12_4_ = auVar36._12_4_;
                    auVar49._0_4_ = -(uint)(auVar36._0_4_ < auVar36._8_4_);
                    auVar49._4_4_ = -(uint)(auVar36._4_4_ < auVar36._12_4_);
                    auVar49._8_8_ = 0;
                    auVar35 = ~auVar49 & auVar45 | auVar36 & auVar49;
                    uVar17 = auVar35._0_4_;
                    uVar24 = auVar35._4_4_;
                    uVar28 = -(uint)((int)uVar17 < (int)uVar24);
                    uVar28 = ~uVar28 & uVar24 | uVar17 & uVar28;
                  }
                }
                iVar23 = (int)(short)local_10c;
              }
              else {
                local_104 = 0;
                uVar28 = 0;
              }
              result->score = iVar23;
              result->end_query = uVar28;
              result->end_ref = local_104;
              parasail_free(local_f8);
              parasail_free(ptr_00);
              parasail_free(ptr);
              parasail_free(ptr_02);
              parasail_free(b_00);
              parasail_free(ptr_01);
              parasail_free(palVar19);
              return result;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    parasail_result_t *result = NULL;
    __m128i vTZero;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_setzero_si128();
    score = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    vTZero = _mm_set1_epi16(PARASAIL_ZERO);
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE= _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF= _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask= _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!pvHMax) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi16(-open), segLen);
    parasail_memset___m128i(pvEaStore, _mm_set1_epi16(-open), segLen);

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = _mm_subs_epi16(vZero,vGapO);

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi16(vH_dag, vZero);
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i cond_zero = _mm_cmpeq_epi16(vH, vZero);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }
            vMaxH = _mm_max_epi16(vH, vMaxH);
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, -open, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_INF, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, -open, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_INF, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, -open, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    vHp = _mm_max_epi16(vHp, vZero);
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vMaxH = _mm_max_epi16(vH, vMaxH);
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvHMax);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}